

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O0

uint __thiscall chipemu::implementation::nmos::read_nodes(nmos *this,uint16_t *ids,uint count)

{
  bool bVar1;
  uint local_24;
  uint local_20;
  uint index;
  uint value;
  uint count_local;
  uint16_t *ids_local;
  nmos *this_local;
  
  local_20 = 0;
  for (local_24 = 0; local_24 < count; local_24 = local_24 + 1) {
    bVar1 = get_node(this,(uint)ids[local_24]);
    local_20 = local_20 * 2 + (uint)bVar1;
  }
  return local_20;
}

Assistant:

unsigned
nmos::read_nodes(const uint16_t* ids, unsigned count) const noexcept
{
    unsigned value = 0;

    for (unsigned index = 0; index < count; ++index) {
        value = (value << 1) + (get_node(ids[index]) ? 1 : 0);
    }
    return value;
}